

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O2

void __thiscall
iqnet::Reactor<iqnet::Null_lock>::unregister_handler
          (Reactor<iqnet::Null_lock> *this,Event_handler *eh)

{
  int iVar1;
  iterator __position;
  hs_iterator __position_00;
  int local_1c;
  
  local_1c = (*eh->_vptr_Event_handler[9])(eh);
  __position = std::
               _Rb_tree<int,_std::pair<const_int,_iqnet::Event_handler_*>,_std::_Select1st<std::pair<const_int,_iqnet::Event_handler_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_iqnet::Event_handler_*>_>_>
               ::find(&(this->handlers)._M_t,&local_1c);
  if ((_Rb_tree_header *)__position._M_node != &(this->handlers)._M_t._M_impl.super__Rb_tree_header)
  {
    std::
    _Rb_tree<int,std::pair<int_const,iqnet::Event_handler*>,std::_Select1st<std::pair<int_const,iqnet::Event_handler*>>,std::less<int>,std::allocator<std::pair<int_const,iqnet::Event_handler*>>>
    ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,iqnet::Event_handler*>,std::_Select1st<std::pair<int_const,iqnet::Event_handler*>>,std::less<int>,std::allocator<std::pair<int_const,iqnet::Event_handler*>>>
                        *)&this->handlers,__position);
    __position_00 = find_handler_state(this,eh);
    std::__cxx11::
    list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>::
    erase(&this->handlers_states,(const_iterator)__position_00._M_node);
    iVar1 = (*eh->_vptr_Event_handler[2])(eh);
    if ((char)iVar1 != '\0') {
      this->num_stoppers = this->num_stoppers - 1;
    }
  }
  return;
}

Assistant:

void Reactor<Lock>::unregister_handler( Event_handler* eh )
{
  scoped_lock lk(lock);
  h_iterator i = handlers.find(eh->get_handler());

  if( i != handlers.end() )
  {
    handlers.erase(i);
    handlers_states.erase(find_handler_state(eh));

    if (eh->is_stopper())
      num_stoppers--;
  }
}